

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_local_masked_variable
          (CompilerMSL *this,SPIRVariable *masked_var,bool strip_array)

{
  SPIRFunction *this_00;
  uint32_t uVar1;
  uint uVar2;
  Vector<std::function<void_()>_> *pVVar3;
  anon_class_24_3_b9a26a94 local_e0;
  function<void_()> local_c8;
  anon_class_24_3_b9a26a94 local_a8;
  function<void_()> local_90;
  uint32_t local_6c;
  uint32_t local_68;
  ID initializer;
  anon_class_16_2_2d4fadee local_60;
  function<void_()> local_50;
  byte local_29;
  SPIRFunction *pSStack_28;
  bool threadgroup_storage;
  SPIRFunction *entry_func;
  SPIRVariable *pSStack_18;
  bool strip_array_local;
  SPIRVariable *masked_var_local;
  CompilerMSL *this_local;
  
  entry_func._7_1_ = strip_array;
  pSStack_18 = masked_var;
  masked_var_local = (SPIRVariable *)this;
  uVar1 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  pSStack_28 = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,uVar1);
  uVar2 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1c])(this,pSStack_18,4);
  this_00 = pSStack_28;
  local_29 = (byte)uVar2 & 1;
  if (((uVar2 & 1) == 0) || (((this->msl_options).multi_patch_workgroup & 1U) == 0)) {
    initializer.id =
         (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_18->super_IVariant).self);
    SPIRFunction::add_local_variable(this_00,(VariableID)initializer.id);
  }
  else {
    pVVar3 = &pSStack_28->fixup_hooks_in;
    local_60.masked_var = pSStack_18;
    local_60.this = this;
    ::std::function<void()>::
    function<spirv_cross::CompilerMSL::emit_local_masked_variable(spirv_cross::SPIRVariable_const&,bool)::__0,void>
              ((function<void()> *)&local_50,&local_60);
    SmallVector<std::function<void_()>,_0UL>::push_back(pVVar3,&local_50);
    ::std::function<void_()>::~function(&local_50);
  }
  if ((local_29 & 1) == 0) {
    local_68 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_18->super_IVariant).self)
    ;
    SmallVector<unsigned_int,_8UL>::push_back(&this->vars_needing_early_declaration,&local_68);
  }
  else {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_18->initializer);
    if (uVar1 != 0) {
      local_e0.initializer.id = (pSStack_18->initializer).id;
      local_6c = local_e0.initializer.id;
      if ((entry_func._7_1_ & 1) == 0) {
        pVVar3 = &pSStack_28->fixup_hooks_in;
        local_e0.masked_var = pSStack_18;
        local_e0.this = this;
        ::std::function<void()>::
        function<spirv_cross::CompilerMSL::emit_local_masked_variable(spirv_cross::SPIRVariable_const&,bool)::__2,void>
                  ((function<void()> *)&local_c8,&local_e0);
        SmallVector<std::function<void_()>,_0UL>::push_back(pVVar3,&local_c8);
        ::std::function<void_()>::~function(&local_c8);
      }
      else {
        pVVar3 = &pSStack_28->fixup_hooks_in;
        local_a8.masked_var = pSStack_18;
        local_a8.this = this;
        local_a8.initializer.id = local_e0.initializer.id;
        ::std::function<void()>::
        function<spirv_cross::CompilerMSL::emit_local_masked_variable(spirv_cross::SPIRVariable_const&,bool)::__1,void>
                  ((function<void()> *)&local_90,&local_a8);
        SmallVector<std::function<void_()>,_0UL>::push_back(pVVar3,&local_90);
        ::std::function<void_()>::~function(&local_90);
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::emit_local_masked_variable(const SPIRVariable &masked_var, bool strip_array)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	bool threadgroup_storage = variable_decl_is_remapped_storage(masked_var, StorageClassWorkgroup);

	if (threadgroup_storage && msl_options.multi_patch_workgroup)
	{
		// We need one threadgroup block per patch, so fake this.
		entry_func.fixup_hooks_in.push_back([this, &masked_var]() {
			auto &type = get_variable_data_type(masked_var);
			add_local_variable_name(masked_var.self);

			bool old_is_builtin = is_using_builtin_array;
			is_using_builtin_array = true;

			const uint32_t max_control_points_per_patch = 32u;
			uint32_t max_num_instances =
					(max_control_points_per_patch + get_entry_point().output_vertices - 1u) /
					get_entry_point().output_vertices;
			statement("threadgroup ", type_to_glsl(type), " ",
			          "spvStorage", to_name(masked_var.self), "[", max_num_instances, "]",
			          type_to_array_glsl(type), ";");

			// Assign a threadgroup slice to each PrimitiveID.
			// We assume here that workgroup size is rounded to 32,
			// since that's the maximum number of control points per patch.
			// We cannot size the array based on fixed dispatch parameters,
			// since Metal does not allow that. :(
			// FIXME: We will likely need an option to support passing down target workgroup size,
			// so we can emit appropriate size here.
			statement("threadgroup ", type_to_glsl(type), " ",
			          "(&", to_name(masked_var.self), ")",
			          type_to_array_glsl(type), " = spvStorage", to_name(masked_var.self), "[",
			          "(", to_expression(builtin_invocation_id_id), ".x / ",
			          get_entry_point().output_vertices, ") % ",
			          max_num_instances, "];");

			is_using_builtin_array = old_is_builtin;
		});
	}
	else
	{
		entry_func.add_local_variable(masked_var.self);
	}

	if (!threadgroup_storage)
	{
		vars_needing_early_declaration.push_back(masked_var.self);
	}
	else if (masked_var.initializer)
	{
		// Cannot directly initialize threadgroup variables. Need fixup hooks.
		ID initializer = masked_var.initializer;
		if (strip_array)
		{
			entry_func.fixup_hooks_in.push_back([this, &masked_var, initializer]() {
				auto invocation = to_tesc_invocation_id();
				statement(to_expression(masked_var.self), "[",
				          invocation, "] = ",
				          to_expression(initializer), "[",
				          invocation, "];");
			});
		}
		else
		{
			entry_func.fixup_hooks_in.push_back([this, &masked_var, initializer]() {
				statement(to_expression(masked_var.self), " = ", to_expression(initializer), ";");
			});
		}
	}
}